

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int CTcParser::skip_to_sem(void)

{
  tc_toktyp_t tVar1;
  CTcTokenizer *in_stack_00000008;
  
  while( true ) {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2502f0);
    if (tVar1 == TOKT_EOF) {
      return 1;
    }
    if (tVar1 - TOKT_LBRACE < 2) break;
    if (tVar1 == TOKT_SEM) {
      CTcTokenizer::next(in_stack_00000008);
      return 0;
    }
    CTcTokenizer::next(in_stack_00000008);
  }
  return 0;
}

Assistant:

int CTcParser::skip_to_sem()
{
    /* keep going until we find a semicolon or some other reason to stop */
    for (;;)
    {
        /* see what we have next */
        switch(G_tok->cur())
        {
        case TOKT_EOF:
            /* end of file - tell the caller not to proceed */
            return 1;

        case TOKT_SEM:
            /* 
             *   it's the semicolon at last - skip it and tell the caller
             *   to proceed 
             */
            G_tok->next();
            return 0;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
            /* 
             *   Don't skip past braces - the caller probably simply left
             *   out a semicolon at the end of a statement, and we've now
             *   reached the next block start or end.  Stop here and tell
             *   the caller to proceed.  
             */
            return 0;

        default:
            /* skip anything else */
            G_tok->next();
            break;
        }
    }
}